

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::compute_split_estimate
          (clusterizer<crnlib::vec<6U,_float>_> *this,vec<6U,_float> *left_child_res,
          vec<6U,_float> *right_child_res,vq_node *parent_node)

{
  float fVar1;
  uint i;
  ulong uVar2;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar3;
  uint i_1;
  float fVar4;
  vec<6U,_float> furthest;
  vec<6U,_float> opposite;
  vec<6U,_float> local_90;
  vec<6U,_float> local_78;
  vec<6U,_float> local_60;
  vec<6U,_float> local_48;
  
  vec<6U,_float>::set(&local_90,0.0);
  fVar1 = -1.0;
  for (uVar2 = 0; uVar2 < (parent_node->m_vectors).m_size; uVar2 = uVar2 + 1) {
    ppVar3 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[uVar2];
    fVar4 = vec<6U,_float>::squared_distance(&ppVar3->first,&parent_node->m_centroid);
    if (fVar1 < fVar4) {
      vec<6U,_float>::operator=(&local_90,&ppVar3->first);
      fVar1 = fVar4;
    }
  }
  vec<6U,_float>::set(&local_48,0.0);
  fVar1 = -1.0;
  for (uVar2 = 0; uVar2 < (parent_node->m_vectors).m_size; uVar2 = uVar2 + 1) {
    ppVar3 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[uVar2];
    fVar4 = vec<6U,_float>::squared_distance(&ppVar3->first,&local_90);
    if (fVar1 < fVar4) {
      vec<6U,_float>::operator=(&local_48,&ppVar3->first);
      fVar1 = fVar4;
    }
  }
  operator+(&local_90,&parent_node->m_centroid);
  operator*(&local_78,0.5);
  vec<6U,_float>::operator=(left_child_res,&local_60);
  operator+(&local_48,&parent_node->m_centroid);
  operator*(&local_78,0.5);
  vec<6U,_float>::operator=(right_child_res,&local_60);
  return;
}

Assistant:

void compute_split_estimate(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node)
        {
            VectorType furthest(0);
            double furthest_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(parent_node.m_centroid);
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest = v;
                }
            }

            VectorType opposite(0);
            double opposite_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(furthest);
                if (dist > opposite_dist)
                {
                    opposite_dist = dist;
                    opposite = v;
                }
            }

            left_child_res = (furthest + parent_node.m_centroid) * .5f;
            right_child_res = (opposite + parent_node.m_centroid) * .5f;
        }